

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChFunctionRotation::Get_a_loc
          (ChVector<double> *__return_storage_ptr__,ChFunctionRotation *this,double s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ChQuaternion<double> q2;
  ChQuaternion<double> q1;
  ChQuaternion<double> q0;
  ChQuaternion<double> local_140;
  double local_120;
  double dStack_118;
  double dStack_110;
  double dStack_108;
  double local_100;
  double dStack_f8;
  double dStack_f0;
  double dStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [24];
  undefined1 local_a8 [16];
  double local_98;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  
  (*this->_vptr_ChFunctionRotation[3])(s + -1e-07,local_e0);
  (*this->_vptr_ChFunctionRotation[3])(s,&local_100,this);
  (*this->_vptr_ChFunctionRotation[3])(s + 1e-07,&local_120,this);
  local_90._0_8_ = local_100 + local_100;
  local_90._8_8_ = dStack_f8 + dStack_f8;
  auVar4._16_8_ = dStack_f0 + dStack_f0;
  auVar4._0_16_ = local_90;
  auVar4._24_8_ = dStack_e8 + dStack_e8;
  auVar2 = vsubpd_avx(local_e0,auVar4);
  auVar7._0_8_ = auVar2._0_8_ + local_120;
  auVar7._8_8_ = auVar2._8_8_ + dStack_118;
  auVar7._16_8_ = auVar2._16_8_ + dStack_110;
  auVar7._24_8_ = auVar2._24_8_ + dStack_108;
  auVar2 = vpermpd_avx2(auVar4,0xec);
  auVar3._8_8_ = 0x42d6bcc41e900001;
  auVar3._0_8_ = 0x42d6bcc41e900001;
  auVar3._16_8_ = 0x42d6bcc41e900001;
  auVar3._24_8_ = 0x42d6bcc41e900001;
  local_140.m_data = (double  [4])vmulpd_avx512vl(auVar7,auVar3);
  auVar1 = vshufpd_avx(local_90,local_90,1);
  auVar6._0_8_ = auVar1._0_8_ ^ 0x8000000000000000;
  auVar6._8_8_ = auVar1._8_8_ ^ 0x8000000000000000;
  local_c0._0_8_ = vmovlpd_avx(auVar6);
  local_c0._8_16_ = auVar2._0_16_;
  auVar5 = auVar4._16_16_;
  auVar9._8_8_ = auVar4._16_8_;
  auVar9._0_8_ = auVar4._16_8_;
  auVar1._8_8_ = 0x8000000000000000;
  auVar1._0_8_ = 0x8000000000000000;
  local_a8 = vxorpd_avx512vl(auVar9,auVar1);
  auVar1 = vshufpd_avx(auVar5,auVar5,1);
  auVar8._0_8_ = auVar1._0_8_ ^ 0x8000000000000000;
  auVar8._8_8_ = auVar1._8_8_ ^ 0x8000000000000000;
  local_80 = vunpcklpd_avx(auVar8,auVar5);
  local_98 = (double)vmovlpd_avx(auVar8);
  local_70 = vunpcklpd_avx(auVar6,local_90);
  chrono::operator*((ChMatrix34<double> *)local_c0,&local_140);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChFunctionRotation::Get_a_loc(double s) const {
		ChQuaternion<> q0 = Get_q(s - BDF_STEP_LOW);
		ChQuaternion<> q1 = Get_q(s);
		ChQuaternion<> q2 = Get_q(s + BDF_STEP_LOW);
		ChQuaternion<> qdtdt = (q0 - q1*2.0 + q2) / (BDF_STEP_LOW*BDF_STEP_LOW);
		ChGlMatrix34<> Gl(q1);
        return Gl * qdtdt;
}